

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void printVector<double>(vector<double,_std::allocator<double>_> *vector)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  int local_14;
  int i;
  vector<double,_std::allocator<double>_> *vector_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(vector);
    if (sVar1 <= (ulong)(long)local_14) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](vector,(long)local_14);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar2);
    std::operator<<(poVar3,',');
    local_14 = local_14 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printVector(const std::vector<T> &vector){
    for(int i=0;i<vector.size();i++){
        std::cout<<vector[i]<<',';
    }
    std::cout<<std::endl;
}